

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int cm_zlib_deflateReset(z_streamp strm)

{
  int iVar1;
  internal_state *piVar2;
  Posf *__s;
  int iVar3;
  ulong uVar4;
  
  iVar3 = cm_zlib_deflateResetKeep(strm);
  if (iVar3 == 0) {
    piVar2 = strm->state;
    piVar2->window_size = (ulong)piVar2->w_size * 2;
    __s = piVar2->head;
    uVar4 = (ulong)(piVar2->hash_size - 1);
    __s[uVar4] = 0;
    memset(__s,0,uVar4 * 2);
    iVar1 = piVar2->level;
    piVar2->max_lazy_match = (uint)configuration_table[iVar1].max_lazy;
    piVar2->good_match = (uint)configuration_table[iVar1].good_length;
    piVar2->nice_match = (uint)configuration_table[iVar1].nice_length;
    piVar2->max_chain_length = (uint)configuration_table[iVar1].max_chain;
    piVar2->block_start = 0;
    piVar2->lookahead = 0;
    piVar2->prev_length = 2;
    piVar2->insert = 0;
    piVar2->match_length = 2;
    piVar2->match_available = 0;
    piVar2->strstart = 0;
    piVar2->ins_h = 0;
  }
  return iVar3;
}

Assistant:

int ZEXPORT deflateReset (strm)
    z_streamp strm;
{
    int ret;

    ret = deflateResetKeep(strm);
    if (ret == Z_OK)
        lm_init(strm->state);
    return ret;
}